

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

void __thiscall duckdb::Optimizer::Optimizer(Optimizer *this,Binder *binder,ClientContext *context)

{
  ExpressionRewriter *args;
  vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_true> *this_00;
  Rule *local_30;
  _Head_base<0UL,_duckdb::Rule_*,_false> local_28;
  
  this->context = context;
  this->binder = binder;
  args = &this->rewriter;
  (this->rewriter).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
       (_func_int **)&PTR__ExpressionRewriter_027a1fb8;
  (this->rewriter).rules.
  super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rewriter).rules.
  super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewriter).rules.
  super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewriter).context = context;
  (this->rewriter).op.ptr = (LogicalOperator *)0x0;
  (this->rewriter).to_apply_rules.
  super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewriter).to_apply_rules.
  super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewriter).to_apply_rules.
  super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  make_uniq<duckdb::ConstantFoldingRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  this_00 = &(this->rewriter).rules;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::DistributivityRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::ArithmeticSimplificationRule,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::CaseSimplificationRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::ConjunctionSimplificationRule,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::DatePartSimplificationRule,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::ComparisonSimplificationRule,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::InClauseSimplificationRule,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::EqualOrNullSimplification,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args)
  ;
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::MoveConstantsRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::LikeOptimizationRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::OrderedAggregateOptimizer,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args)
  ;
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::DistinctAggregateOptimizer,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::DistinctWindowedOptimizer,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args)
  ;
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::RegexOptimizationRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::EmptyNeedleRemovalRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::EnumComparisonRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::JoinDependentFilterRule,duckdb::ExpressionRewriter&>((duckdb *)&local_30,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (*local_30->_vptr_Rule[1])();
  }
  make_uniq<duckdb::TimeStampComparison,duckdb::ClientContext&,duckdb::ExpressionRewriter&>
            ((duckdb *)&local_30,context,args);
  local_28._M_head_impl = local_30;
  local_30 = (Rule *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>,std::allocator<duckdb::unique_ptr<duckdb::Rule,std::default_delete<duckdb::Rule>,true>>>
              *)this_00,
             (unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *)&local_28);
  if (local_28._M_head_impl != (Rule *)0x0) {
    (*(local_28._M_head_impl)->_vptr_Rule[1])();
  }
  local_28._M_head_impl = (Rule *)0x0;
  if (local_30 != (Rule *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return;
}

Assistant:

Optimizer::Optimizer(Binder &binder, ClientContext &context) : context(context), binder(binder), rewriter(context) {
	rewriter.rules.push_back(make_uniq<ConstantFoldingRule>(rewriter));
	rewriter.rules.push_back(make_uniq<DistributivityRule>(rewriter));
	rewriter.rules.push_back(make_uniq<ArithmeticSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<CaseSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<ConjunctionSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<DatePartSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<ComparisonSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<InClauseSimplificationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<EqualOrNullSimplification>(rewriter));
	rewriter.rules.push_back(make_uniq<MoveConstantsRule>(rewriter));
	rewriter.rules.push_back(make_uniq<LikeOptimizationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<OrderedAggregateOptimizer>(rewriter));
	rewriter.rules.push_back(make_uniq<DistinctAggregateOptimizer>(rewriter));
	rewriter.rules.push_back(make_uniq<DistinctWindowedOptimizer>(rewriter));
	rewriter.rules.push_back(make_uniq<RegexOptimizationRule>(rewriter));
	rewriter.rules.push_back(make_uniq<EmptyNeedleRemovalRule>(rewriter));
	rewriter.rules.push_back(make_uniq<EnumComparisonRule>(rewriter));
	rewriter.rules.push_back(make_uniq<JoinDependentFilterRule>(rewriter));
	rewriter.rules.push_back(make_uniq<TimeStampComparison>(context, rewriter));

#ifdef DEBUG
	for (auto &rule : rewriter.rules) {
		// root not defined in rule
		D_ASSERT(rule->root);
	}
#endif
}